

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall r_exec::View::delete_from_group(View *this)

{
  Group *this_00;
  
  this_00 = get_host(this);
  std::mutex::lock(&this_00->mutex);
  Group::delete_view(this_00,this);
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex);
  return;
}

Assistant:

void View::delete_from_group()
{
    Group *g = get_host();
    std::lock_guard<std::mutex> guard(g->mutex);
    g->delete_view(this);
}